

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O2

void __thiscall
Temperature_ConversionsUnitPrecise_Test::~Temperature_ConversionsUnitPrecise_Test
          (Temperature_ConversionsUnitPrecise_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, ConversionsUnitPrecise)
{
    using namespace units::precise;

    EXPECT_NEAR(
        convert(neg_forty_C, degC, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C, degC, K),
        neg_forty_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(neg_forty_C_in_F, degF, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, K, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, K, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C, degC, degF), zero_C_in_F, test::precise_tolerance);
    EXPECT_NEAR(convert(zero_C, degC, K), zero_C_in_K, test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C_in_F, degF, degC), zero_C, test::precise_tolerance);
    EXPECT_NEAR(convert(zero_C_in_K, K, degC), zero_C, test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, K, degF), zero_C_in_F, test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C, degC, degF), five_C_in_F, test::precise_tolerance);
    EXPECT_NEAR(convert(five_C, degC, K), five_C_in_K, test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C_in_F, degF, degC), five_C, test::precise_tolerance);
    EXPECT_NEAR(convert(five_C_in_K, K, degC), five_C, test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, K, degF), five_C_in_F, test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C, degC, degF),
        hundred_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C, degC, K), hundred_C_in_K, test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C_in_F, degF, degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, K, degC), hundred_C, test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, K, degF),
        hundred_C_in_F,
        test::precise_tolerance);
}